

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_inter.c
# Opt level: O3

void sys_setrealtime(char *libdir)

{
  int iVar1;
  __pid_t _Var2;
  int *piVar3;
  float extraout_XMM0_Da;
  stat statbuf;
  char cmdbuf [1000];
  stat local_488;
  char local_3f8 [999];
  undefined1 local_11;
  
  if (sys_hipriority == -1) {
    sys_hipriority = 1;
  }
  snprintf(local_3f8,1000,"%s/bin/pd-watchdog",libdir);
  local_11 = 0;
  if (sys_hipriority != 0) {
    iVar1 = stat(local_3f8,&local_488);
    if (iVar1 < 0) {
      fprintf(_stderr,"disabling real-time priority due to missing pd-watchdog (%s)\n",local_3f8);
      sys_hipriority = 0;
    }
    else if (sys_hipriority != 0) {
      iVar1 = pipe((int *)&local_488);
      if (iVar1 < 0) {
        sys_sockerror("pipe");
        return;
      }
      _Var2 = fork();
      if (-1 < _Var2) {
        if (_Var2 != 0) {
          sys_set_priority(1);
          close((int)local_488.st_dev);
          iVar1 = fcntl(local_488.st_dev._4_4_,2,1);
          if (iVar1 < 0) {
            perror("close-on-exec");
          }
          sys_watchfd = local_488.st_dev._4_4_;
          return;
        }
        sys_setrealtime_cold_1();
        sys_exit();
        sys_close_audio();
        sys_close_midi();
        if ((pd_maininstance.pd_inter)->i_havegui != 0) {
          socket_close((pd_maininstance.pd_inter)->i_guisock);
          sys_rmpollfn((pd_maininstance.pd_inter)->i_guisock);
        }
        exit((int)extraout_XMM0_Da);
      }
      piVar3 = __errno_location();
      if (*piVar3 == 0) {
        sys_setrealtime_cold_2();
        return;
      }
      perror("sys_setpriority");
      return;
    }
  }
  logpost((void *)0x0,4,"not setting real-time priority");
  return;
}

Assistant:

void sys_setrealtime(const char *libdir)
{
    char cmdbuf[MAXPDSTRING];
#if defined(__linux__) || defined(__FreeBSD_kernel__)
        /*  promote this process's priority, if we can and want to.
        If sys_hipriority not specified (-1), we assume real-time was wanted.
        Starting in Linux 2.6 one can permit real-time operation of Pd by]
        putting lines like:
                @audio - rtprio 99
                @audio - memlock unlimited
        in the system limits file, perhaps /etc/limits.conf or
        /etc/security/limits.conf, and calling Pd from a user in group audio. */
    if (sys_hipriority == -1)
        sys_hipriority = 1;

    snprintf(cmdbuf, MAXPDSTRING, "%s/bin/pd-watchdog", libdir);
    cmdbuf[MAXPDSTRING-1] = 0;
    if (sys_hipriority)
    {
        struct stat statbuf;
        if (stat(cmdbuf, &statbuf) < 0)
        {
            fprintf(stderr,
              "disabling real-time priority due to missing pd-watchdog (%s)\n",
                cmdbuf);
            sys_hipriority = 0;
        }
    }
    if (sys_hipriority)
    {
        int pipe9[2], watchpid;
            /* To prevent lockup, we fork off a watchdog process with
            higher real-time priority than ours.  The GUI has to send
            a stream of ping messages to the watchdog THROUGH the Pd
            process which has to pick them up from the GUI and forward
            them.  If any of these things aren't happening the watchdog
            starts sending "stop" and "cont" signals to the Pd process
            to make it timeshare with the rest of the system.  (Version
            0.33P2 : if there's no GUI, the watchdog pinging is done
            from the scheduler idle routine in this process instead.) */

        if (pipe(pipe9) < 0)
        {
            sys_sockerror("pipe");
            return;
        }
        watchpid = fork();
        if (watchpid < 0)
        {
            if (errno)
                perror("sys_setpriority");
            else fprintf(stderr, "sys_setpriority failed\n");
            return;
        }
        else if (!watchpid)             /* we're the child */
        {
            sys_set_priority(MODE_WATCHDOG);
            if (pipe9[1] != 0)
            {
                dup2(pipe9[0], 0);
                close(pipe9[0]);
            }
            close(pipe9[1]);

            if (sys_verbose) fprintf(stderr, "%s\n", cmdbuf);
            execl(cmdbuf, cmdbuf, (char*)0);
            perror("pd: exec");
            _exit(1);
        }
        else                            /* we're the parent */
        {
            sys_set_priority(MODE_RT);
            close(pipe9[0]);
                /* set close-on-exec so that watchdog will see an EOF when we
                close our copy - otherwise it might hang waiting for some
                stupid child process (as seems to happen if jackd auto-starts
                for us.) */
            if(fcntl(pipe9[1], F_SETFD, FD_CLOEXEC) < 0)
              perror("close-on-exec");
            sys_watchfd = pipe9[1];
                /* We also have to start the ping loop in the GUI;
                this is done later when the socket is open. */
        }
    }
    else logpost(NULL, PD_VERBOSE, "not setting real-time priority");
#endif /* __linux__ */

#ifdef _WIN32
    if (!SetPriorityClass(GetCurrentProcess(), HIGH_PRIORITY_CLASS))
        fprintf(stderr, "pd: couldn't set high priority class\n");
#endif
#ifdef __APPLE__
    if (sys_hipriority)
    {
        struct sched_param param;
        int policy = SCHED_RR;
        int err;
        param.sched_priority = 80; /* adjust 0 : 100 */

        err = pthread_setschedparam(pthread_self(), policy, &param);
        if (err)
            post("warning: high priority scheduling failed");
    }
#endif /* __APPLE__ */
}